

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.h
# Opt level: O2

bool __thiscall Func::DoLoopFastPaths(Func *this)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  
  bVar1 = IsSimpleJit(this);
  if ((!bVar1) || (DAT_01441e6c == '\x01')) {
    uVar2 = GetSourceContextId(this);
    uVar3 = GetLocalFunctionId(this);
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,FastPathPhase,uVar2,uVar3);
    if (!bVar1) {
      uVar2 = GetSourceContextId(this);
      uVar3 = GetLocalFunctionId(this);
      bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,LoopFastPathPhase,uVar2,uVar3);
      return !bVar1;
    }
  }
  return false;
}

Assistant:

bool DoLoopFastPaths() const
    {
        return
            (!IsSimpleJit() || CONFIG_FLAG(NewSimpleJit)) &&
            !PHASE_OFF(Js::FastPathPhase, this) &&
            !PHASE_OFF(Js::LoopFastPathPhase, this);
    }